

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_enum_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  MTBDD MVar2;
  uint8_t *puVar3;
  long lVar4;
  byte bVar5;
  
  do {
    lVar4 = (dd & 0xffffffffff) * 0x10;
    while( true ) {
      puVar3 = arr;
      arr = puVar3 + 1;
      if ((dd & 0x7fffffffffffffff) == 0) {
        bVar5 = 1;
      }
      else {
        bVar5 = (nodes->data[lVar4 + 7] & 0x40) >> 6;
      }
      if (variables == 0x8000000000000000) {
        return 0;
      }
      if (bVar5 != 0) {
        return 0;
      }
      puVar1 = nodes->data;
      variables = variables & 0x8000000000000000 ^
                  *(ulong *)(puVar1 + (variables & 0xffffffffff) * 0x10) & 0x800000ffffffffff;
      if (*puVar3 == '\x01') break;
      if (*puVar3 == '\0') {
        MVar2 = mtbdd_enum_next(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff |
                                dd & 0x8000000000000000,variables,arr,filter_cb);
        if (MVar2 == 0) {
          MVar2 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff ^
                                   dd & 0x8000000000000000,variables,arr,filter_cb);
          if (MVar2 == 0) {
            MVar2 = 0;
          }
          else {
            *puVar3 = '\x01';
          }
        }
        return MVar2;
      }
    }
    dd = dd & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff;
  } while( true );
}

Assistant:

MTBDD
mtbdd_enum_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (mtbdd_isleaf(dd)) {
        // we find the leaf in 'enum_next', then we've seen it before...
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        return mtbdd_false;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        variables = mtbdd_gethigh(variables);

        if (*arr == 0) {
            // previous was low
            mtbddnode_t n = MTBDD_GETNODE(dd);
            MTBDD res = mtbdd_enum_next(node_getlow(dd, n), variables, arr+1, filter_cb);
            if (res != mtbdd_false) {
                return res;
            } else {
                // try to find new in high branch
                res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
                if (res != mtbdd_false) {
                    *arr = 1;
                    return res;
                } else {
                    return mtbdd_false;
                }
            }
        } else if (*arr == 1) {
            // previous was high
            mtbddnode_t n = MTBDD_GETNODE(dd);
            return mtbdd_enum_next(node_gethigh(dd, n), variables, arr+1, filter_cb);
        } else {
            // previous was either
            return mtbdd_enum_next(dd, variables, arr+1, filter_cb);
        }
    }
}